

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_erk.c
# Opt level: O2

ARKODE_ERKTableID arkButcherTableERKNameToID(char *emethod)

{
  int iVar1;
  ARKODE_ERKTableID AVar2;
  
  iVar1 = strcmp("ARKODE_ERK_NONE",emethod);
  AVar2 = ARKODE_ERK_NONE;
  if (iVar1 != 0) {
    iVar1 = strcmp("ARKODE_FORWARD_EULER_1_1",emethod);
    if (iVar1 == 0) {
      AVar2 = ARKODE_FORWARD_EULER_1_1;
    }
    else {
      iVar1 = strcmp("ARKODE_HEUN_EULER_2_1_2",emethod);
      if (iVar1 == 0) {
        AVar2 = ARKODE_HEUN_EULER_2_1_2;
      }
      else {
        iVar1 = strcmp("ARKODE_RALSTON_EULER_2_1_2",emethod);
        if (iVar1 == 0) {
          AVar2 = ARKODE_RALSTON_EULER_2_1_2;
        }
        else {
          iVar1 = strcmp("ARKODE_EXPLICIT_MIDPOINT_EULER_2_1_2",emethod);
          if (iVar1 == 0) {
            AVar2 = ARKODE_EXPLICIT_MIDPOINT_EULER_2_1_2;
          }
          else {
            iVar1 = strcmp("ARKODE_ARK2_ERK_3_1_2",emethod);
            if (iVar1 == 0) {
              AVar2 = ARKODE_ARK2_ERK_3_1_2;
            }
            else {
              iVar1 = strcmp("ARKODE_BOGACKI_SHAMPINE_4_2_3",emethod);
              if (iVar1 == 0) {
                AVar2 = ARKODE_BOGACKI_SHAMPINE_4_2_3;
              }
              else {
                iVar1 = strcmp("ARKODE_ARK324L2SA_ERK_4_2_3",emethod);
                if (iVar1 == 0) {
                  AVar2 = ARKODE_ARK324L2SA_ERK_4_2_3;
                }
                else {
                  iVar1 = strcmp("ARKODE_SHU_OSHER_3_2_3",emethod);
                  if (iVar1 == 0) {
                    AVar2 = ARKODE_SHU_OSHER_3_2_3;
                  }
                  else {
                    iVar1 = strcmp("ARKODE_SOFRONIOU_SPALETTA_5_3_4",emethod);
                    if (iVar1 == 0) {
                      AVar2 = ARKODE_SOFRONIOU_SPALETTA_5_3_4;
                    }
                    else {
                      iVar1 = strcmp("ARKODE_ZONNEVELD_5_3_4",emethod);
                      if (iVar1 == 0) {
                        AVar2 = ARKODE_ZONNEVELD_5_3_4;
                      }
                      else {
                        iVar1 = strcmp("ARKODE_ARK436L2SA_ERK_6_3_4",emethod);
                        if (iVar1 == 0) {
                          AVar2 = ARKODE_ARK436L2SA_ERK_6_3_4;
                        }
                        else {
                          iVar1 = strcmp("ARKODE_ARK437L2SA_ERK_7_3_4",emethod);
                          if (iVar1 == 0) {
                            AVar2 = ARKODE_ARK437L2SA_ERK_7_3_4;
                          }
                          else {
                            iVar1 = strcmp("ARKODE_SAYFY_ABURUB_6_3_4",emethod);
                            if (iVar1 == 0) {
                              AVar2 = ARKODE_SAYFY_ABURUB_6_3_4;
                            }
                            else {
                              iVar1 = strcmp("ARKODE_CASH_KARP_6_4_5",emethod);
                              if (iVar1 == 0) {
                                AVar2 = ARKODE_CASH_KARP_6_4_5;
                              }
                              else {
                                iVar1 = strcmp("ARKODE_FEHLBERG_6_4_5",emethod);
                                if (iVar1 == 0) {
                                  AVar2 = ARKODE_FEHLBERG_6_4_5;
                                }
                                else {
                                  iVar1 = strcmp("ARKODE_DORMAND_PRINCE_7_4_5",emethod);
                                  if (iVar1 == 0) {
                                    AVar2 = ARKODE_DORMAND_PRINCE_7_4_5;
                                  }
                                  else {
                                    iVar1 = strcmp("ARKODE_ARK548L2SA_ERK_8_4_5",emethod);
                                    if (iVar1 == 0) {
                                      AVar2 = ARKODE_ARK548L2SA_ERK_8_4_5;
                                    }
                                    else {
                                      iVar1 = strcmp("ARKODE_ARK548L2SAb_ERK_8_4_5",emethod);
                                      if (iVar1 == 0) {
                                        AVar2 = ARKODE_ARK548L2SAb_ERK_8_4_5;
                                      }
                                      else {
                                        iVar1 = strcmp("ARKODE_VERNER_8_5_6",emethod);
                                        if (iVar1 == 0) {
                                          AVar2 = ARKODE_VERNER_8_5_6;
                                        }
                                        else {
                                          iVar1 = strcmp("ARKODE_VERNER_9_5_6",emethod);
                                          if (iVar1 == 0) {
                                            AVar2 = ARKODE_VERNER_9_5_6;
                                          }
                                          else {
                                            iVar1 = strcmp("ARKODE_VERNER_10_6_7",emethod);
                                            if (iVar1 == 0) {
                                              AVar2 = ARKODE_VERNER_10_6_7;
                                            }
                                            else {
                                              iVar1 = strcmp("ARKODE_VERNER_13_7_8",emethod);
                                              if (iVar1 == 0) {
                                                AVar2 = ARKODE_VERNER_13_7_8;
                                              }
                                              else {
                                                iVar1 = strcmp("ARKODE_VERNER_16_8_9",emethod);
                                                if (iVar1 == 0) {
                                                  AVar2 = ARKODE_VERNER_16_8_9;
                                                }
                                                else {
                                                  iVar1 = strcmp("ARKODE_FEHLBERG_13_7_8",emethod);
                                                  if (iVar1 == 0) {
                                                    AVar2 = ARKODE_FEHLBERG_13_7_8;
                                                  }
                                                  else {
                                                    iVar1 = strcmp("ARKODE_KNOTH_WOLKE_3_3",emethod)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      AVar2 = ARKODE_KNOTH_WOLKE_3_3;
                                                    }
                                                    else {
                                                      arkProcessError((ARKodeMem)0x0,-0x16,0x5c,
                                                                      "arkButcherTableERKNameToID",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_butcher_erk.c"
                                                  ,"Unknown Butcher table");
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return AVar2;
}

Assistant:

ARKODE_ERKTableID arkButcherTableERKNameToID(const char* emethod)
{
  /* Use X-macro to test each method name */
#define ARK_BUTCHER_TABLE(name, coeff) \
  if (strcmp(#name, emethod) == 0) { return name; }
#include "arkode_butcher_erk.def"
#undef ARK_BUTCHER_TABLE

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown Butcher table");

  return ARKODE_ERK_NONE;
}